

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boostdep.cpp
# Opt level: O0

void __thiscall
module_overview_csv_actions::module2(module_overview_csv_actions *this,string *module)

{
  string *module_local;
  module_overview_csv_actions *this_local;
  
  if ((this->first_module_ & 1U) == 0) {
    std::operator<<((ostream *)&std::cout," ");
  }
  else {
    this->first_module_ = false;
  }
  std::operator<<((ostream *)&std::cout,(string *)module);
  return;
}

Assistant:

void module2( std::string const & module )
    {
        if( first_module_ )
            first_module_ = false;
        else
            std::cout << " ";
        std::cout << module;
    }